

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::setKeyNumber(MidiMessage *this,int value)

{
  bool bVar1;
  
  bVar1 = isNote(this);
  if (!bVar1) {
    bVar1 = isAftertouch(this);
    if (!bVar1) {
      return;
    }
  }
  setP1(this,value & 0x7f);
  return;
}

Assistant:

void MidiMessage::setKeyNumber(int value) {
	if (isNote() || isAftertouch()) {
		setP1(value & 0x7f);
	} else {
		// don't do anything since this is not a note-related message.
	}
}